

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

Bool Conic_To(black_PWorker worker,Long cx,Long cy,Long x,Long y)

{
  ulong uVar1;
  Long LVar2;
  ulong uVar3;
  bool overshoot;
  Bool BVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  TStates aState;
  TPoint *base;
  TPoint *pTVar8;
  TPoint arcs [65];
  TPoint local_448;
  Long local_438;
  Long local_430;
  Long local_428;
  Long local_420;
  
  local_428 = worker->lastX;
  local_420 = worker->lastY;
  local_438 = cx;
  local_430 = cy;
  local_448.x = x;
  local_448.y = y;
  base = &local_448;
  do {
    uVar1 = base[2].y;
    LVar2 = base->x;
    uVar3 = base->y;
    uVar6 = uVar3;
    if ((long)uVar3 < (long)uVar1) {
      uVar6 = uVar1;
    }
    uVar7 = uVar3;
    if ((long)uVar1 < (long)uVar3) {
      uVar7 = uVar1;
    }
    if ((base[1].y < (long)uVar7) || ((long)uVar6 < base[1].y)) {
      pTVar8 = base + 2;
      Split_Conic(base);
    }
    else {
      if (uVar1 != uVar3) {
        aState = ((long)uVar3 <= (long)uVar1) + Ascending_State;
        if (worker->state != aState) {
          if ((long)uVar1 < (long)uVar3) {
            uVar6 = (-(long)worker->precision & ((long)worker->precision + uVar1) - 1) - uVar1;
          }
          else {
            uVar6 = (long)(worker->precision + -1) & uVar1;
          }
          overshoot = (long)worker->precision_half <= (long)uVar6;
          if ((worker->state != Unknown_State) &&
             (BVar4 = End_Profile(worker,overshoot), BVar4 != '\0')) {
            return '\x01';
          }
          BVar4 = New_Profile(worker,aState,overshoot);
          if (BVar4 != '\0') {
            return '\x01';
          }
        }
        if ((long)uVar1 < (long)uVar3) {
          cVar5 = Bezier_Up(worker,2,base,Split_Conic,worker->minY,worker->maxY);
        }
        else {
          cVar5 = Bezier_Down(worker,2,base,Split_Conic,worker->minY,worker->maxY);
        }
        if (cVar5 != '\0') {
          return '\x01';
        }
      }
      pTVar8 = base + -2;
    }
    base = pTVar8;
    if (pTVar8 < &local_448) {
      worker->lastX = LVar2;
      worker->lastY = uVar3;
      return '\0';
    }
  } while( true );
}

Assistant:

static Bool
  Conic_To( RAS_ARGS Long  cx,
                     Long  cy,
                     Long  x,
                     Long  y )
  {
    Long     y1, y2, y3, x3, ymin, ymax;
    TStates  state_bez;
    TPoint   arcs[2 * MaxBezier + 1]; /* The Bezier stack           */
    TPoint*  arc;                     /* current Bezier arc pointer */


    arc      = arcs;
    arc[2].x = ras.lastX;
    arc[2].y = ras.lastY;
    arc[1].x = cx;
    arc[1].y = cy;
    arc[0].x = x;
    arc[0].y = y;

    do
    {
      y1 = arc[2].y;
      y2 = arc[1].y;
      y3 = arc[0].y;
      x3 = arc[0].x;

      /* first, categorize the Bezier arc */

      if ( y1 <= y3 )
      {
        ymin = y1;
        ymax = y3;
      }
      else
      {
        ymin = y3;
        ymax = y1;
      }

      if ( y2 < ymin || y2 > ymax )
      {
        /* this arc has no given direction, split it! */
        Split_Conic( arc );
        arc += 2;
      }
      else if ( y1 == y3 )
      {
        /* this arc is flat, ignore it and pop it from the Bezier stack */
        arc -= 2;
      }
      else
      {
        /* the arc is y-monotonous, either ascending or descending */
        /* detect a change of direction                            */
        state_bez = y1 < y3 ? Ascending_State : Descending_State;
        if ( ras.state != state_bez )
        {
          Bool  o = ( state_bez == Ascending_State )
                      ? IS_BOTTOM_OVERSHOOT( y1 )
                      : IS_TOP_OVERSHOOT( y1 );


          /* finalize current profile if any */
          if ( ras.state != Unknown_State &&
               End_Profile( RAS_VARS o )  )
            goto Fail;

          /* create a new profile */
          if ( New_Profile( RAS_VARS state_bez, o ) )
            goto Fail;
        }

        /* now call the appropriate routine */
        if ( state_bez == Ascending_State )
        {
          if ( Bezier_Up( RAS_VARS 2, arc, Split_Conic,
                                   ras.minY, ras.maxY ) )
            goto Fail;
        }
        else
          if ( Bezier_Down( RAS_VARS 2, arc, Split_Conic,
                                     ras.minY, ras.maxY ) )
            goto Fail;
        arc -= 2;
      }

    } while ( arc >= arcs );

    ras.lastX = x3;
    ras.lastY = y3;

    return SUCCESS;

  Fail:
    return FAILURE;
  }